

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O2

uint __thiscall Shell::EqualityProxyMono::getProxyPredicate(EqualityProxyMono *this,TermList sort)

{
  undefined1 *puVar1;
  Symbol *this_00;
  bool bVar2;
  uint taArity;
  OperatorType *type;
  Literal *lit;
  Literal *lit_00;
  Formula *pFVar3;
  AtomicFormula *this_01;
  AtomicFormula *this_02;
  FormulaUnit *this_03;
  InferenceStore *this_04;
  TermList in_R8;
  TermList sort_local;
  uint pred;
  NonspecificInference0 local_62;
  Inference local_60;
  
  sort_local = sort;
  bVar2 = Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                    (&s_proxyPredicates,&sort_local,&pred);
  if (!bVar2) {
    taArity = Kernel::Signature::addFreshPredicate(DAT_00a14190,2,"sQ","eqProxy");
    this_00 = (DAT_00a14190->_preds)._stack[taArity];
    local_60._0_8_ = sort_local._content;
    local_60._8_8_ = sort_local._content;
    type = Kernel::OperatorType::getPredicateType
                     ((OperatorType *)&local_60,(initializer_list<Kernel::TermList>)ZEXT816(2),
                      taArity);
    Kernel::Signature::Symbol::setType(this_00,type);
    puVar1 = &this_00->field_0x40;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x40040;
    Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (&s_proxyPredicates,sort_local,taArity);
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (&s_proxyPredicateSorts,taArity,sort_local);
    lit = Kernel::Literal::create2((Literal *)(ulong)taArity,1,true,(TermList)0x5,in_R8);
    lit_00 = Kernel::Literal::createEquality(true,(TermList)0x1,(TermList)0x5,sort_local);
    pFVar3 = (Formula *)Kernel::BinaryFormula::operator_new(0x38);
    this_01 = (AtomicFormula *)Kernel::AtomicFormula::operator_new(0x30);
    Kernel::AtomicFormula::AtomicFormula(this_01,lit);
    this_02 = (AtomicFormula *)Kernel::AtomicFormula::operator_new(0x30);
    Kernel::AtomicFormula::AtomicFormula(this_02,lit_00);
    Kernel::Formula::Formula(pFVar3,IFF);
    *(AtomicFormula **)(pFVar3 + 1) = this_01;
    pFVar3[1]._label._M_dataplus._M_p = (pointer)this_02;
    pFVar3 = Kernel::Formula::quantify(pFVar3);
    this_03 = (FormulaUnit *)Kernel::FormulaUnit::operator_new(0x48);
    local_62.inputType = AXIOM;
    local_62.rule = EQUALITY_PROXY_AXIOM1;
    Kernel::Inference::Inference(&local_60,&local_62);
    Kernel::FormulaUnit::FormulaUnit(this_03,pFVar3,&local_60);
    Lib::DHMap<Kernel::TermList,_Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (&s_proxyPremises,sort_local,(Unit *)this_03);
    this_04 = Kernel::InferenceStore::instance();
    Kernel::InferenceStore::recordIntroducedSymbol(this_04,(Unit *)this_03,PRED,taArity);
    pred = taArity;
  }
  return pred;
}

Assistant:

unsigned EqualityProxyMono::getProxyPredicate(TermList sort)
{
  unsigned pred;
  if (s_proxyPredicates.find(sort, pred)) {
    return pred;
  }

  unsigned newPred = env.signature->addFreshPredicate(2,"sQ","eqProxy");
  Signature::Symbol* predSym = env.signature->getPredicate(newPred);
  OperatorType* predType = OperatorType::getPredicateType({sort, sort});
  predSym->setType(predType);
  predSym->markEqualityProxy();
  // don't need congruence axioms for the equality predicate itself
  predSym->markSkipCongruence();

  ASS(sort.isTerm());
  ASS(sort.term()->shared());
  ASS(sort.term()->ground());

  ALWAYS(s_proxyPredicates.insert(sort,newPred));
  s_proxyPredicateSorts.insert(newPred,sort);

  Literal* proxyLit = Literal::create2(newPred,true,TermList(0,false),TermList(1,false));
  Literal* eqLit = Literal::createEquality(true,TermList(0,false),TermList(1,false),sort);
  Formula* defForm = new BinaryFormula(IFF, new AtomicFormula(proxyLit), new AtomicFormula(eqLit));
  Formula* quantDefForm = Formula::quantify(defForm);

  FormulaUnit* defUnit = new FormulaUnit(quantDefForm,NonspecificInference0(UnitInputType::AXIOM,InferenceRule::EQUALITY_PROXY_AXIOM1));

  s_proxyPremises.insert(sort, defUnit);
  InferenceStore::instance()->recordIntroducedSymbol(defUnit, SymbolType::PRED, newPred);
  return newPred;
}